

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall
libtorrent::dht::node::put_item
          (node *this,public_key *pk,string *salt,
          function<void_(const_libtorrent::dht::item_&,_int)> *f,
          function<void_(libtorrent::dht::item_&)> *data_cb)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__args;
  uint uVar1;
  element_type *peVar2;
  span<const_char> in;
  _func_void_vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_ptr_shared_ptr<libtorrent::dht::put_data>_ptr
  *local_118;
  type local_110;
  _func_void_item_ptr_bool_shared_ptr<libtorrent::dht::put_data>_ptr_function<void_(libtorrent::dht::item_&)>_ptr
  *local_e8;
  type local_e0;
  undefined1 local_a8 [8];
  shared_ptr<libtorrent::dht::get_item> ta;
  shared_ptr<libtorrent::dht::put_data> put_ta;
  undefined8 local_80;
  undefined1 local_78 [8];
  char hex_key [65];
  function<void_(libtorrent::dht::item_&)> *data_cb_local;
  function<void_(const_libtorrent::dht::item_&,_int)> *f_local;
  string *salt_local;
  public_key *pk_local;
  node *this_local;
  
  unique0x10000293 = data_cb;
  if ((this->m_observer != (dht_observer *)0x0) &&
     (uVar1 = (**(this->m_observer->super_dht_logger)._vptr_dht_logger)(this->m_observer,1),
     (uVar1 & 1) != 0)) {
    span<char_const>::span<std::array<char,32ul>,char,void>
              ((span<char_const> *)
               &put_ta.super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&pk->bytes);
    in.m_len = (difference_type)local_78;
    in.m_ptr = (char *)local_80;
    libtorrent::aux::to_hex
              ((aux *)put_ta.
                      super___shared_ptr<libtorrent::dht::put_data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi,in,(char *)f);
    (*(this->m_observer->super_dht_logger)._vptr_dht_logger[1])
              (this->m_observer,1,"starting put for [ key: %s ]",local_78);
  }
  __args = &ta.super___shared_ptr<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ;
  ::std::
  make_shared<libtorrent::dht::put_data,libtorrent::dht::node&,std::function<void(libtorrent::dht::item_const&,int)>&>
            ((node *)__args,(function<void_(const_libtorrent::dht::item_&,_int)> *)this);
  local_e8 = anon_unknown_0::put_data_cb;
  ::std::
  bind<void(*)(libtorrent::dht::item_const&,bool,std::shared_ptr<libtorrent::dht::put_data>const&,std::function<void(libtorrent::dht::item&)>const&),std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::shared_ptr<libtorrent::dht::put_data>&,std::function<void(libtorrent::dht::item&)>&>
            (&local_e0,&local_e8,(_Placeholder<1> *)&::std::placeholders::_1,
             (_Placeholder<2> *)&::std::placeholders::_2,
             (shared_ptr<libtorrent::dht::put_data> *)__args,data_cb);
  local_118 = anon_unknown_0::put;
  ::std::
  bind<void(*)(std::vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>const&,std::shared_ptr<libtorrent::dht::put_data>const&),std::_Placeholder<1>const&,std::shared_ptr<libtorrent::dht::put_data>&>
            (&local_110,&local_118,(_Placeholder<1> *)&::std::placeholders::_1,
             (shared_ptr<libtorrent::dht::put_data> *)
             &ta.super___shared_ptr<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::
  make_shared<libtorrent::dht::get_item,libtorrent::dht::node&,libtorrent::dht::public_key_const&,std::__cxx11::string_const&,std::_Bind<void(*(std::_Placeholder<1>,std::_Placeholder<2>,std::shared_ptr<libtorrent::dht::put_data>,std::function<void(libtorrent::dht::item&)>))(libtorrent::dht::item_const&,bool,std::shared_ptr<libtorrent::dht::put_data>const&,std::function<void(libtorrent::dht::item&)>const&)>,std::_Bind<void(*(std::_Placeholder<1>,std::shared_ptr<libtorrent::dht::put_data>))(std::vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>const&,std::shared_ptr<libtorrent::dht::put_data>const&)>>
            ((node *)local_a8,(public_key *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pk,
             (_Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::put_data>,_std::function<void_(libtorrent::dht::item_&)>))(const_libtorrent::dht::item_&,_bool,_const_std::shared_ptr<libtorrent::dht::put_data>_&,_const_std::function<void_(libtorrent::dht::item_&)>_&)>
              *)salt,(_Bind<void_(*(std::_Placeholder<1>,_std::shared_ptr<libtorrent::dht::put_data>))(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_std::shared_ptr<libtorrent::dht::put_data>_&)>
                      *)&local_e0);
  ::std::
  _Bind<void_(*(std::_Placeholder<1>,_std::shared_ptr<libtorrent::dht::put_data>))(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_const_std::shared_ptr<libtorrent::dht::put_data>_&)>
  ::~_Bind(&local_110);
  ::std::
  _Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_std::shared_ptr<libtorrent::dht::put_data>,_std::function<void_(libtorrent::dht::item_&)>))(const_libtorrent::dht::item_&,_bool,_const_std::shared_ptr<libtorrent::dht::put_data>_&,_const_std::function<void_(libtorrent::dht::item_&)>_&)>
  ::~_Bind(&local_e0);
  peVar2 = ::std::
           __shared_ptr_access<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_a8);
  (*(peVar2->super_find_data).super_traversal_algorithm._vptr_traversal_algorithm[3])();
  ::std::shared_ptr<libtorrent::dht::get_item>::~shared_ptr
            ((shared_ptr<libtorrent::dht::get_item> *)local_a8);
  ::std::shared_ptr<libtorrent::dht::put_data>::~shared_ptr
            ((shared_ptr<libtorrent::dht::put_data> *)
             &ta.super___shared_ptr<libtorrent::dht::get_item,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void node::put_item(public_key const& pk, std::string const& salt
	, std::function<void(item const&, int)> f
	, std::function<void(item&)> data_cb)
{
#ifndef TORRENT_DISABLE_LOGGING
	if (m_observer != nullptr && m_observer->should_log(dht_logger::node))
	{
		char hex_key[65];
		aux::to_hex(pk.bytes, hex_key);
		m_observer->log(dht_logger::node, "starting put for [ key: %s ]", hex_key);
	}
#endif

	auto put_ta = std::make_shared<dht::put_data>(*this, f);

	auto ta = std::make_shared<dht::get_item>(*this, pk, salt
		, std::bind(&put_data_cb, _1, _2, put_ta, data_cb)
		, std::bind(&put, _1, put_ta));
	ta->start();
}